

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_curve_to
               (nk_draw_list *list,nk_vec2 p2,nk_vec2 p3,nk_vec2 p4,uint num_segments)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  nk_vec2 nVar5;
  nk_vec2 pos;
  float local_74;
  float y;
  float x;
  float w4;
  float w3;
  float w2;
  float w1;
  float u;
  float t;
  float local_40;
  float fStack_3c;
  nk_vec2 p1;
  uint i_step;
  float t_step;
  uint num_segments_local;
  nk_draw_list *list_local;
  nk_vec2 p4_local;
  nk_vec2 p3_local;
  nk_vec2 p2_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2723,
                  "void nk_draw_list_path_curve_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, unsigned int)"
                 );
  }
  if (list->path_count == 0) {
    __assert_fail("list->path_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2724,
                  "void nk_draw_list_path_curve_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, unsigned int)"
                 );
  }
  if ((list != (nk_draw_list *)0x0) && (list->path_count != 0)) {
    local_74 = (float)num_segments;
    if (num_segments == 0) {
      local_74 = 1.4013e-45;
    }
    nVar5 = nk_draw_list_path_last(list);
    for (p1.y = 1.4013e-45; (uint)p1.y <= (uint)local_74; p1.y = (float)((int)p1.y + 1)) {
      fVar1 = (1.0 / (float)(uint)local_74) * (float)(uint)p1.y;
      fVar2 = 1.0 - fVar1;
      fVar3 = fVar2 * fVar2 * fVar2;
      fVar4 = fVar2 * 3.0 * fVar2 * fVar1;
      fVar2 = fVar2 * 3.0 * fVar1 * fVar1;
      fVar1 = fVar1 * fVar1 * fVar1;
      local_40 = nVar5.x;
      p3_local.x = p2.x;
      p4_local.x = p3.x;
      list_local._0_4_ = p4.x;
      fStack_3c = nVar5.y;
      p3_local.y = p2.y;
      p4_local.y = p3.y;
      list_local._4_4_ = p4.y;
      pos = nk_vec2(fVar1 * list_local._0_4_ +
                    fVar2 * p4_local.x + fVar3 * local_40 + fVar4 * p3_local.x,
                    fVar1 * list_local._4_4_ +
                    fVar2 * p4_local.y + fVar3 * fStack_3c + fVar4 * p3_local.y);
      nk_draw_list_path_line_to(list,pos);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_curve_to(struct nk_draw_list *list, struct nk_vec2 p2,
    struct nk_vec2 p3, struct nk_vec2 p4, unsigned int num_segments)
{
    float t_step;
    unsigned int i_step;
    struct nk_vec2 p1;

    NK_ASSERT(list);
    NK_ASSERT(list->path_count);
    if (!list || !list->path_count) return;
    num_segments = NK_MAX(num_segments, 1);

    p1 = nk_draw_list_path_last(list);
    t_step = 1.0f/(float)num_segments;
    for (i_step = 1; i_step <= num_segments; ++i_step) {
        float t = t_step * (float)i_step;
        float u = 1.0f - t;
        float w1 = u*u*u;
        float w2 = 3*u*u*t;
        float w3 = 3*u*t*t;
        float w4 = t * t *t;
        float x = w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x;
        float y = w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y;
        nk_draw_list_path_line_to(list, nk_vec2(x,y));
    }
}